

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_ExplicitlyMapEntryError_Test::
TestBody(ParserValidationErrorTest_ExplicitlyMapEntryError_Test *this)

{
  string_view text;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  MStack_28;
  
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&MStack_28,
            "2:11: map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.\n");
  text._M_str = 
  "message Foo {\n  message ValueEntry {\n    option map_entry = true;\n    optional int32 key = 1;\n    optional int32 value = 2;\n    extensions 99 to 999;\n  }\n}"
  ;
  text._M_len = 0x9b;
  ParserTest::ExpectHasErrors
            (&this->super_ParserValidationErrorTest,text,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&MStack_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&MStack_28);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, ExplicitlyMapEntryError) {
  ExpectHasErrors(
      "message Foo {\n"
      "  message ValueEntry {\n"
      "    option map_entry = true;\n"
      "    optional int32 key = 1;\n"
      "    optional int32 value = 2;\n"
      "    extensions 99 to 999;\n"
      "  }\n"
      "}",
      "2:11: map_entry should not be set explicitly. Use "
      "map<KeyType, ValueType> instead.\n");
}